

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall
String::token(String *__return_storage_ptr__,String *this,char *separators,usize *start)

{
  char *pcVar1;
  char *pcVar2;
  usize uVar3;
  long length;
  String *result;
  
  pcVar1 = operator_cast_to_char_(this);
  uVar3 = *start;
  pcVar2 = strpbrk(pcVar1 + uVar3,separators);
  if (pcVar2 == (char *)0x0) {
    substr(__return_storage_ptr__,this,uVar3,-1);
    uVar3 = this->data->len;
  }
  else {
    length = (long)pcVar2 - (long)(pcVar1 + uVar3);
    substr(__return_storage_ptr__,this,uVar3,length);
    uVar3 = *start + length + 1;
  }
  *start = uVar3;
  return __return_storage_ptr__;
}

Assistant:

String String::token(const char* separators, usize& start) const
{
  const char* p = *this + start;
  const char* endStr = strpbrk(p, separators);
  if(endStr)
  {
    usize len = endStr - p;
    String result = substr(start, len);
    start += len + 1;
    return result;
  }
  String result = substr(start);
  start = data->len;
  return result;
}